

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglplatformcontext.cpp
# Opt level: O2

EGLSurface __thiscall
QEGLPlatformContext::createTemporaryOffscreenSurface(QEGLPlatformContext *this)

{
  EGLConfig pvVar1;
  EGLSurface pvVar2;
  long in_FS_OFFSET;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined4 local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = 0x100003057;
  uStack_30 = 0x100003056;
  local_28 = 0x3058;
  local_20 = 0x3038;
  pvVar1 = q_configFromGLFormat(this->m_eglDisplay,&this->m_format,false,1);
  pvVar2 = (EGLSurface)eglCreatePbufferSurface(this->m_eglDisplay,pvVar1,&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pvVar2;
  }
  __stack_chk_fail();
}

Assistant:

EGLSurface QEGLPlatformContext::createTemporaryOffscreenSurface()
{
    // Make the context current to ensure the GL version query works. This needs a surface too.
    const EGLint pbufferAttributes[] = {
        EGL_WIDTH, 1,
        EGL_HEIGHT, 1,
        EGL_LARGEST_PBUFFER, EGL_FALSE,
        EGL_NONE
    };

    // Cannot just pass m_eglConfig because it may not be suitable for pbuffers. Instead,
    // do what QEGLPbuffer would do: request a config with the same attributes but with
    // PBUFFER_BIT set.
    EGLConfig config = q_configFromGLFormat(m_eglDisplay, m_format, false, EGL_PBUFFER_BIT);

    return eglCreatePbufferSurface(m_eglDisplay, config, pbufferAttributes);
}